

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromFile
          (TinyGLTF *this,Model *model,string *err,string *warn,string *filename,uint check_sections
          )

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  string fileerr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string basedir;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if ((this->fs).ReadWholeFile.super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to read file: ",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,": one or more FS callback not set",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)err,(string *)&fileerr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileerr._M_dataplus._M_p != &fileerr.field_2) {
        operator_delete(fileerr._M_dataplus._M_p);
      }
    }
    bVar1 = false;
  }
  else {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fileerr._M_dataplus._M_p = (pointer)&fileerr.field_2;
    fileerr._M_string_length = 0;
    fileerr.field_2._M_local_buf[0] = '\0';
    bVar1 = std::
            function<bool_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void_*)>
            ::operator()(&(this->fs).ReadWholeFile,&data,&fileerr,filename,(this->fs).user_data);
    if (bVar1) {
      GetBaseDir(&basedir,filename);
      if ((long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        uVar3 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fileerr._M_dataplus._M_p != &fileerr.field_2) {
          operator_delete(fileerr._M_dataplus._M_p);
        }
        if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar3);
      }
      bVar1 = LoadBinaryFromMemory
                        (this,model,err,warn,
                         data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (uint)((long)data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start),&basedir,
                         check_sections);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)basedir._M_dataplus._M_p != &basedir.field_2) {
        operator_delete(basedir._M_dataplus._M_p);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to read file: ",0x15);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,fileerr._M_dataplus._M_p,fileerr._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (err != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)err,(string *)&basedir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)basedir._M_dataplus._M_p != &basedir.field_2) {
          operator_delete(basedir._M_dataplus._M_p);
        }
      }
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileerr._M_dataplus._M_p != &fileerr.field_2) {
      operator_delete(fileerr._M_dataplus._M_p);
    }
    if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  return bVar1;
}

Assistant:

bool TinyGLTF::LoadBinaryFromFile(Model *model, std::string *err,
                                  std::string *warn,
                                  const std::string &filename,
                                  unsigned int check_sections) {
  std::stringstream ss;

  if (fs.ReadWholeFile == nullptr) {
    // Programmer error, assert() ?
    ss << "Failed to read file: " << filename
       << ": one or more FS callback not set" << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::vector<unsigned char> data;
  std::string fileerr;
  bool fileread = fs.ReadWholeFile(&data, &fileerr, filename, fs.user_data);
  if (!fileread) {
    ss << "Failed to read file: " << filename << ": " << fileerr << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::string basedir = GetBaseDir(filename);

  bool ret = LoadBinaryFromMemory(model, err, warn, &data.at(0),
                                  static_cast<unsigned int>(data.size()),
                                  basedir, check_sections);

  return ret;
}